

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,QFileInfo>>::
emplace<std::pair<QString,QFileInfo>const&>
          (QMovableArrayOps<std::pair<QString,QFileInfo>> *this,qsizetype i,
          pair<QString,_QFileInfo> *args)

{
  long lVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  Inserter local_70;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar2 = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)this);
      if (qVar2 == 0) goto LAB_0056bbc6;
      std::pair<QString,_QFileInfo>::pair
                ((pair<QString,_QFileInfo> *)(*(long *)(this + 0x10) * 0x20 + *(long *)(this + 8)),
                 args);
LAB_0056bcae:
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      goto LAB_0056bc6d;
    }
LAB_0056bbc6:
    if (i == 0) {
      qVar2 = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::freeSpaceAtBegin
                        ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)this);
      if (qVar2 != 0) {
        std::pair<QString,_QFileInfo>::pair
                  ((pair<QString,_QFileInfo> *)(*(long *)(this + 8) + -0x20),args);
        *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
        goto LAB_0056bcae;
      }
    }
  }
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  std::pair<QString,_QFileInfo>::pair((pair<QString,_QFileInfo> *)local_48,args);
  lVar1 = *(long *)(this + 0x10);
  QArrayDataPointer<std::pair<QString,_QFileInfo>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)this,(uint)(i == 0 && lVar1 != 0),
             1,(pair<QString,_QFileInfo> **)0x0,
             (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0x0);
  if (i == 0 && lVar1 != 0) {
    std::pair<QString,_QFileInfo>::pair
              ((pair<QString,_QFileInfo> *)(*(long *)(this + 8) + -0x20),
               (pair<QString,_QFileInfo> *)local_48);
    *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    QMovableArrayOps<std::pair<QString,_QFileInfo>_>::Inserter::Inserter
              (&local_70,(QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)this,i,1);
    std::pair<QString,_QFileInfo>::pair(local_70.displaceFrom,(pair<QString,_QFileInfo> *)local_48);
    local_70.displaceFrom = local_70.displaceFrom + 1;
    QMovableArrayOps<std::pair<QString,_QFileInfo>_>::Inserter::~Inserter(&local_70);
  }
  std::pair<QString,_QFileInfo>::~pair((pair<QString,_QFileInfo> *)local_48);
LAB_0056bc6d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }